

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void createBasicTextures(void)

{
  undefined8 uVar1;
  undefined8 in_RAX;
  u8 blue [3];
  undefined5 uStack_35;
  undefined2 auStack_34 [2];
  
  _blue = in_RAX;
  (*glad_debug_glGenSamplers)(1,&gpu::basicSampler);
  (*glad_debug_glSamplerParameteri)(gpu::basicSampler,0x2801,0x2600);
  (*glad_debug_glSamplerParameteri)(gpu::basicSampler,0x2800,0x2600);
  (*glad_debug_glGenTextures)(2,&gpu::whiteTexture);
  uVar1 = _blue;
  _blue = CONCAT17(auStack_34[1]._1_1_,0xff000000000000);
  _blue = CONCAT24(0xffff,(int)uVar1);
  (*glad_debug_glBindTexture)(0xde1,gpu::whiteTexture);
  (*glad_debug_glTexImage2D)(0xde1,0,0x1907,1,1,0,0x1907,0x1401,auStack_34);
  _blue = CONCAT53(uStack_35,0xff0000);
  (*glad_debug_glBindTexture)(0xde1,0);
  (*glad_debug_glTexImage2D)(0xde1,0,0x1907,1,1,0,0x1907,0x1401,blue);
  return;
}

Assistant:

void createBasicTextures()
{
    glGenSamplers(1, &gpu::basicSampler);
    glSamplerParameteri(gpu::basicSampler, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glSamplerParameteri(gpu::basicSampler, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

    glGenTextures(2, &gpu::whiteTexture);

    const u8 white[3] = {255, 255, 255};
    glBindTexture(GL_TEXTURE_2D, gpu::whiteTexture);
    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, 1, 1, 0, GL_RGB, GL_UNSIGNED_BYTE, white);

    const u8 blue[3] = {0, 0, 255};
    glBindTexture(GL_TEXTURE_2D, gpu::blueTexture);
    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, 1, 1, 0, GL_RGB, GL_UNSIGNED_BYTE, blue);
}